

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::QuerySurfaceCase::checkCommonAttributes
          (QuerySurfaceCase *this,EGLDisplay display,EGLSurface surface,ConfigInfo *info)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  EGLint EVar3;
  EGLint EVar4;
  Library *egl;
  MessageBuilder local_1b0;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3028);
  if (EVar3 != info->configId) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, config ID ");
    std::ostream::operator<<(poVar1,EVar3);
    std::operator<<((ostream *)poVar1," does not match the one used to create the surface");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Config ID mismatch");
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  EVar4 = eglu::querySurfaceInt(egl,display,surface,0x3056);
  if (EVar3 < 1 || EVar4 < 1) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid surface size ");
    std::ostream::operator<<(poVar1,EVar3);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,EVar4);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface size");
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3090);
  EVar4 = eglu::querySurfaceInt(egl,display,surface,0x3091);
  if (((EVar4 != -1) && (EVar3 != -1)) && (EVar3 < 1 || EVar4 < 1)) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid surface resolution ");
    std::ostream::operator<<(poVar1,EVar3);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,EVar4);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface resolution");
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3092);
  if (EVar3 != -1 && EVar3 < 1) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid pixel aspect ratio ");
    EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3092);
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid pixel aspect ratio");
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3086);
  if (EVar3 - 0x3086U < 0xfffffffe) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid render buffer value ");
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid render buffer");
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3099);
  if (EVar3 - 0x309cU < 0xfffffffe) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid multisample resolve value ");
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0023616e:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid multisample resolve");
  }
  else if ((EVar3 == 0x309b) && ((info->surfaceType & 0x200) == 0)) {
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "    Fail, multisample resolve is reported as box filter but configuration does not support it."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_0023616e;
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3093);
  if (EVar3 - 0x3096U < 0xfffffffe) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid swap behavior value ");
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00236232:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid swap behavior");
  }
  else if ((EVar3 == 0x3094) && ((info->surfaceType & 0x400) == 0)) {
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "    Fail, swap behavior is reported as preserve but configuration does not support it."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00236232;
  }
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3088);
  if (EVar3 - 0x308dU < 0xfffffffe) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid alpha format value ");
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if ((EVar3 != 0x308c) || ((info->surfaceType & 0x40) != 0)) goto LAB_00236311;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "    Fail, is set to use premultiplied alpha but configuration does not support it."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::TestContext::setTestResult
            ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Invalid alpha format");
LAB_00236311:
  EVar3 = eglu::querySurfaceInt(egl,display,surface,0x3087);
  if (EVar3 - 0x308bU < 0xfffffffe) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"    Fail, invalid color space value ");
    std::ostream::operator<<(poVar1,EVar3);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (EVar3 != 0x308a) {
      return;
    }
    if ((info->surfaceType & 0x20) != 0) {
      return;
    }
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "    Fail, is set to use a linear color space but configuration does not support it."
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::TestContext::setTestResult
            ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Invalid color space");
  return;
}

Assistant:

void QuerySurfaceCase::checkCommonAttributes (EGLDisplay display, EGLSurface surface, const ConfigInfo& info)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log		= m_testCtx.getLog();

	// Attributes which are common to all surface types

	// Config ID
	{
		const EGLint	id	= eglu::querySurfaceInt(egl, display, surface, EGL_CONFIG_ID);

		if (id != info.configId)
		{
			log << TestLog::Message << "    Fail, config ID " << id << " does not match the one used to create the surface" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Config ID mismatch");
		}
	}

	// Width and height
	{
		const EGLint	width	= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
		const EGLint	height	= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);

		if (width <= 0 || height <= 0)
		{
			log << TestLog::Message << "    Fail, invalid surface size " << width << "x" << height << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
		}
	}

	// Horizontal and vertical resolution
	{
		const EGLint	hRes	= eglu::querySurfaceInt(egl, display, surface, EGL_HORIZONTAL_RESOLUTION);
		const EGLint	vRes	= eglu::querySurfaceInt(egl, display, surface, EGL_VERTICAL_RESOLUTION);

		if ((hRes <= 0 || vRes <= 0) && (hRes != EGL_UNKNOWN && vRes != EGL_UNKNOWN))
		{
			log << TestLog::Message << "    Fail, invalid surface resolution " << hRes << "x" << vRes << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface resolution");
		}
	}

	// Pixel aspect ratio
	{
		const EGLint	pixelRatio	= eglu::querySurfaceInt(egl, display, surface, EGL_PIXEL_ASPECT_RATIO);

		if (pixelRatio <= 0 && pixelRatio != EGL_UNKNOWN)
		{
			log << TestLog::Message << "    Fail, invalid pixel aspect ratio " << eglu::querySurfaceInt(egl, display, surface, EGL_PIXEL_ASPECT_RATIO) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixel aspect ratio");
		}
	}

	// Render buffer
	{
		const EGLint	renderBuffer	= eglu::querySurfaceInt(egl, display, surface, EGL_RENDER_BUFFER);

		if (renderBuffer != EGL_BACK_BUFFER && renderBuffer != EGL_SINGLE_BUFFER)
		{
			log << TestLog::Message << "    Fail, invalid render buffer value " << renderBuffer << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
		}
	}

	// Multisample resolve
	{
		const EGLint	multisampleResolve	= eglu::querySurfaceInt(egl, display, surface, EGL_MULTISAMPLE_RESOLVE);

		if (multisampleResolve != EGL_MULTISAMPLE_RESOLVE_DEFAULT && multisampleResolve != EGL_MULTISAMPLE_RESOLVE_BOX)
		{
			log << TestLog::Message << "    Fail, invalid multisample resolve value " << multisampleResolve << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid multisample resolve");
		}

		if (multisampleResolve == EGL_MULTISAMPLE_RESOLVE_BOX && !(info.surfaceType & EGL_MULTISAMPLE_RESOLVE_BOX_BIT))
		{
			log << TestLog::Message << "    Fail, multisample resolve is reported as box filter but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid multisample resolve");
		}
	}

	// Swap behavior
	{
		const EGLint	swapBehavior	= eglu::querySurfaceInt(egl, display, surface, EGL_SWAP_BEHAVIOR);

		if (swapBehavior != EGL_BUFFER_DESTROYED && swapBehavior != EGL_BUFFER_PRESERVED)
		{
			log << TestLog::Message << "    Fail, invalid swap behavior value " << swapBehavior << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid swap behavior");
		}

		if (swapBehavior == EGL_BUFFER_PRESERVED && !(info.surfaceType & EGL_SWAP_BEHAVIOR_PRESERVED_BIT))
		{
			log << TestLog::Message << "    Fail, swap behavior is reported as preserve but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid swap behavior");
		}
	}

	// alpha format
	{
		const EGLint	alphaFormat	= eglu::querySurfaceInt(egl, display, surface, EGL_ALPHA_FORMAT);

		if (alphaFormat != EGL_ALPHA_FORMAT_NONPRE && alphaFormat != EGL_ALPHA_FORMAT_PRE)
		{
			log << TestLog::Message << "    Fail, invalid alpha format value " << alphaFormat << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha format");
		}

		if (alphaFormat == EGL_ALPHA_FORMAT_PRE && !(info.surfaceType & EGL_VG_ALPHA_FORMAT_PRE_BIT))
		{
			log << TestLog::Message << "    Fail, is set to use premultiplied alpha but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha format");
		}
	}

	// color space
	{
		const EGLint	colorspace	= eglu::querySurfaceInt(egl, display, surface, EGL_COLORSPACE);

		if (colorspace != EGL_VG_COLORSPACE_sRGB && colorspace != EGL_VG_COLORSPACE_LINEAR)
		{
			log << TestLog::Message << "    Fail, invalid color space value " << colorspace << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color space");
		}

		if (colorspace == EGL_VG_COLORSPACE_LINEAR && !(info.surfaceType & EGL_VG_COLORSPACE_LINEAR_BIT))
		{
			log << TestLog::Message << "    Fail, is set to use a linear color space but configuration does not support it." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color space");
		}
	}
}